

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btContinuousConvexCollision.cpp
# Opt level: O0

bool __thiscall
btContinuousConvexCollision::calcTimeOfImpact
          (btContinuousConvexCollision *this,btTransform *fromA,btTransform *toA,btTransform *fromB,
          btTransform *toB,CastResult *result)

{
  long *plVar1;
  float fVar2;
  btVector3 *pbVar3;
  long in_RDI;
  long *in_R9;
  btScalar bVar4;
  btScalar bVar5;
  btVector3 bVar6;
  btPointCollector pointCollector;
  btPointCollector *in_stack_000000a8;
  btTransform *in_stack_000000b0;
  btTransform *in_stack_000000b8;
  btContinuousConvexCollision *in_stack_000000c0;
  btTransform relativeTrans;
  btTransform interpolatedTransB;
  btTransform interpolatedTransA;
  btScalar dLambda;
  btScalar projectedLinearVelocity;
  btScalar dist;
  btPointCollector pointCollector1;
  btScalar radius;
  int numIter;
  btScalar lastLambda;
  btVector3 c;
  bool hasResult;
  btVector3 n;
  int maxIter;
  btVector3 v;
  btScalar lambda;
  btScalar relLinVelocLength;
  btVector3 relLinVel;
  btScalar maxAngularProjectedVelocity;
  btScalar boundingRadiusB;
  btScalar boundingRadiusA;
  btVector3 angVelB;
  btVector3 linVelB;
  btVector3 angVelA;
  btVector3 linVelA;
  btTransform *in_stack_fffffffffffffcc8;
  btTransform *in_stack_fffffffffffffcd0;
  btVector3 *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  float local_2dc;
  btTransform *in_stack_fffffffffffffd30;
  btTransform *in_stack_fffffffffffffd38;
  btVector3 *in_stack_fffffffffffffd40;
  btVector3 *in_stack_fffffffffffffd48;
  undefined4 local_2b0;
  btScalar in_stack_fffffffffffffd54;
  float in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  btScalar in_stack_fffffffffffffd64;
  btScalar local_298;
  btScalar local_294;
  btVector3 local_290 [2];
  btTransform *in_stack_fffffffffffffd90;
  btScalar in_stack_fffffffffffffd9c;
  btVector3 *in_stack_fffffffffffffda0;
  btVector3 *in_stack_fffffffffffffda8;
  btTransform *in_stack_fffffffffffffdb0;
  btTransform local_1c0;
  float local_180;
  btScalar local_17c;
  btScalar local_178;
  btScalar local_174;
  btVector3 local_170;
  int local_160;
  btScalar local_15c;
  float local_158;
  btTransform *local_140;
  btVector3 *pbStack_138;
  btVector3 *local_130;
  long local_128;
  float local_120;
  byte local_11c;
  float local_114;
  int local_110;
  float local_10c;
  btVector3 *local_108;
  long local_100;
  byte local_f5;
  btScalar local_f4;
  btScalar local_f0;
  btScalar local_ec;
  btTransform *local_e8;
  btVector3 *pbStack_e0;
  int local_cc;
  btScalar local_c8;
  btScalar local_c4;
  btScalar local_c0;
  btVector3 local_bc;
  float local_ac;
  undefined8 local_a8;
  undefined8 local_a0;
  btScalar local_98;
  btVector3 local_94;
  float local_84;
  float local_80;
  float local_7c;
  btVector3 local_78;
  btVector3 local_68;
  btVector3 local_58;
  btVector3 local_48;
  long *local_38;
  byte local_1;
  
  local_38 = in_R9;
  btVector3::btVector3(&local_48);
  btVector3::btVector3(&local_58);
  btVector3::btVector3(&local_68);
  btVector3::btVector3(&local_78);
  btTransformUtil::calculateVelocity
            ((btTransform *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (btTransform *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
             in_stack_fffffffffffffd54,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  btTransformUtil::calculateVelocity
            ((btTransform *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (btTransform *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
             in_stack_fffffffffffffd54,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  local_7c = (float)(**(code **)(**(long **)(in_RDI + 0x18) + 0x20))();
  if (*(long *)(in_RDI + 0x20) == 0) {
    local_2dc = 0.0;
  }
  else {
    local_2dc = (float)(**(code **)(**(long **)(in_RDI + 0x20) + 0x20))();
  }
  local_80 = local_2dc;
  bVar4 = btVector3::length((btVector3 *)0x1e3254);
  fVar2 = local_7c;
  bVar5 = btVector3::length((btVector3 *)0x1e3276);
  local_84 = bVar4 * fVar2 + bVar5 * local_80;
  bVar6 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcd8);
  local_94.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_94.m_floats._0_8_ = bVar6.m_floats._0_8_;
  bVar6 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcd8);
  local_a0 = bVar6.m_floats._8_8_;
  local_a8 = bVar6.m_floats._0_8_;
  local_98 = btVector3::length((btVector3 *)0x1e3302);
  if ((local_98 + local_84 != 0.0) || (NAN(local_98 + local_84))) {
    local_ac = 0.0;
    local_c0 = 1.0;
    local_c4 = 0.0;
    local_c8 = 0.0;
    btVector3::btVector3(&local_bc,&local_c0,&local_c4,&local_c8);
    local_cc = 0x40;
    btVector3::btVector3((btVector3 *)&local_e8);
    local_ec = 0.0;
    local_f0 = 0.0;
    local_f4 = 0.0;
    btVector3::setValue((btVector3 *)&local_e8,&local_ec,&local_f0,&local_f4);
    local_f5 = 0;
    btVector3::btVector3((btVector3 *)&local_108);
    local_10c = local_ac;
    local_110 = 0;
    local_114 = 0.001;
    btPointCollector::btPointCollector
              ((btPointCollector *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    computeClosestPoints(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    local_f5 = local_11c & 1;
    local_108 = local_130;
    local_100 = local_128;
    if (local_f5 == 0) {
      local_1 = 0;
      local_160 = 1;
    }
    else {
      local_158 = local_120 + *(float *)(local_38 + 0x17);
      local_e8 = local_140;
      pbStack_e0 = pbStack_138;
      local_15c = btVector3::dot(&local_94,(btVector3 *)&local_e8);
      if (1.1920929e-07 < local_15c + local_84) {
        do {
          if (local_158 <= local_114) {
            *(float *)(local_38 + 0x15) = local_ac;
            local_38[0x11] = (long)local_e8;
            local_38[0x12] = (long)pbStack_e0;
            local_38[0x13] = (long)local_108;
            local_38[0x14] = local_100;
            local_1 = 1;
            local_160 = 1;
            break;
          }
          if (local_38[0x16] != 0) {
            plVar1 = (long *)local_38[0x16];
            local_174 = 1.0;
            local_178 = 1.0;
            local_17c = 1.0;
            btVector3::btVector3(&local_170,&local_174,&local_178,&local_17c);
            (**(code **)(*plVar1 + 0x38))(0x3e4ccccd,plVar1,&local_108,&local_170);
          }
          local_180 = 0.0;
          bVar4 = btVector3::dot(&local_94,(btVector3 *)&local_e8);
          local_15c = bVar4;
          if (bVar4 + local_84 <= 1.1920929e-07) {
            local_1 = 0;
            local_160 = 1;
            break;
          }
          local_180 = local_158 / (bVar4 + local_84);
          local_ac = local_ac + local_180;
          if (1.0 < local_ac) {
            local_1 = 0;
            local_160 = 1;
            break;
          }
          if (local_ac < 0.0) {
            local_1 = 0;
            local_160 = 1;
            break;
          }
          if (local_ac <= local_10c) {
            local_1 = 0;
            local_160 = 1;
            break;
          }
          local_10c = local_ac;
          btTransform::btTransform(in_stack_fffffffffffffcd0);
          btTransform::btTransform(in_stack_fffffffffffffcd0);
          btTransform::btTransform(in_stack_fffffffffffffcd0);
          btTransformUtil::integrateTransform
                    (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                     in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90);
          btTransformUtil::integrateTransform
                    (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                     in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90);
          btTransform::inverseTimes(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
          btTransform::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          if (local_38[0x16] != 0) {
            in_stack_fffffffffffffcd0 = (btTransform *)local_38[0x16];
            pbVar3 = btTransform::getOrigin(&local_1c0);
            local_294 = 1.0;
            local_298 = 0.0;
            btVector3::btVector3
                      (local_290,&local_294,&local_298,(btScalar *)&stack0xfffffffffffffd64);
            (**(code **)(*(long *)(in_stack_fffffffffffffcd0->m_basis).m_el[0].m_floats + 0x38))
                      (0x3e4ccccd,in_stack_fffffffffffffcd0,pbVar3,local_290);
          }
          (**(code **)*local_38)(local_ac);
          btPointCollector::btPointCollector
                    ((btPointCollector *)CONCAT44(bVar4,in_stack_fffffffffffffce0));
          computeClosestPoints
                    (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
          if ((in_stack_fffffffffffffd5c & 1) == 0) {
            (**(code **)(*local_38 + 0x10))(local_38,0xffffffff,local_110);
            local_1 = 0;
            local_160 = 1;
          }
          else {
            local_158 = in_stack_fffffffffffffd58 + *(float *)(local_38 + 0x17);
            local_100 = CONCAT44(in_stack_fffffffffffffd54,local_2b0);
            local_110 = local_110 + 1;
            local_108 = in_stack_fffffffffffffd48;
            local_e8 = in_stack_fffffffffffffd38;
            pbStack_e0 = in_stack_fffffffffffffd40;
            if (local_cc < local_110) {
              (**(code **)(*local_38 + 0x10))(local_38,0xfffffffe,local_110);
              local_1 = 0;
              local_160 = 1;
            }
            else {
              local_160 = 0;
            }
          }
          btPointCollector::~btPointCollector((btPointCollector *)0x1e3a24);
        } while (local_160 == 0);
      }
      else {
        local_1 = 0;
        local_160 = 1;
      }
    }
    btPointCollector::~btPointCollector((btPointCollector *)0x1e3ad4);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool	btContinuousConvexCollision::calcTimeOfImpact(
				const btTransform& fromA,
				const btTransform& toA,
				const btTransform& fromB,
				const btTransform& toB,
				CastResult& result)
{


	/// compute linear and angular velocity for this interval, to interpolate
	btVector3 linVelA,angVelA,linVelB,angVelB;
	btTransformUtil::calculateVelocity(fromA,toA,btScalar(1.),linVelA,angVelA);
	btTransformUtil::calculateVelocity(fromB,toB,btScalar(1.),linVelB,angVelB);


	btScalar boundingRadiusA = m_convexA->getAngularMotionDisc();
	btScalar boundingRadiusB = m_convexB1?m_convexB1->getAngularMotionDisc():0.f;

	btScalar maxAngularProjectedVelocity = angVelA.length() * boundingRadiusA + angVelB.length() * boundingRadiusB;
	btVector3 relLinVel = (linVelB-linVelA);

	btScalar relLinVelocLength = (linVelB-linVelA).length();
	
	if ((relLinVelocLength+maxAngularProjectedVelocity) == 0.f)
		return false;



	btScalar lambda = btScalar(0.);
	btVector3 v(1,0,0);

	int maxIter = MAX_ITERATIONS;

	btVector3 n;
	n.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	bool hasResult = false;
	btVector3 c;

	btScalar lastLambda = lambda;
	//btScalar epsilon = btScalar(0.001);

	int numIter = 0;
	//first solution, using GJK


	btScalar radius = 0.001f;
//	result.drawCoordSystem(sphereTr);

	btPointCollector	pointCollector1;

	{
	
		computeClosestPoints(fromA,fromB,pointCollector1);

		hasResult = pointCollector1.m_hasResult;
		c = pointCollector1.m_pointInWorld;
	}

	if (hasResult)
	{
		btScalar dist;
		dist = pointCollector1.m_distance + result.m_allowedPenetration;
		n = pointCollector1.m_normalOnBInWorld;
		btScalar projectedLinearVelocity = relLinVel.dot(n);
		if ((projectedLinearVelocity+ maxAngularProjectedVelocity)<=SIMD_EPSILON)
			return false;

		//not close enough
		while (dist > radius)
		{
			if (result.m_debugDrawer)
			{
				result.m_debugDrawer->drawSphere(c,0.2f,btVector3(1,1,1));
			}
			btScalar dLambda = btScalar(0.);

			projectedLinearVelocity = relLinVel.dot(n);

			
			//don't report time of impact for motion away from the contact normal (or causes minor penetration)
			if ((projectedLinearVelocity+ maxAngularProjectedVelocity)<=SIMD_EPSILON)
				return false;
			
			dLambda = dist / (projectedLinearVelocity+ maxAngularProjectedVelocity);

			
			
			lambda = lambda + dLambda;

			if (lambda > btScalar(1.))
				return false;

			if (lambda < btScalar(0.))
				return false;


			//todo: next check with relative epsilon
			if (lambda <= lastLambda)
			{
				return false;
				//n.setValue(0,0,0);
				break;
			}
			lastLambda = lambda;

			

			//interpolate to next lambda
			btTransform interpolatedTransA,interpolatedTransB,relativeTrans;

			btTransformUtil::integrateTransform(fromA,linVelA,angVelA,lambda,interpolatedTransA);
			btTransformUtil::integrateTransform(fromB,linVelB,angVelB,lambda,interpolatedTransB);
			relativeTrans = interpolatedTransB.inverseTimes(interpolatedTransA);

			if (result.m_debugDrawer)
			{
				result.m_debugDrawer->drawSphere(interpolatedTransA.getOrigin(),0.2f,btVector3(1,0,0));
			}

			result.DebugDraw( lambda );

			btPointCollector	pointCollector;
			computeClosestPoints(interpolatedTransA,interpolatedTransB,pointCollector);

			if (pointCollector.m_hasResult)
			{
				dist = pointCollector.m_distance+result.m_allowedPenetration;
				c = pointCollector.m_pointInWorld;		
				n = pointCollector.m_normalOnBInWorld;
			} else
			{
				result.reportFailure(-1, numIter);
				return false;
			}

			numIter++;
			if (numIter > maxIter)
			{
				result.reportFailure(-2, numIter);
				return false;
			}
		}
	
		result.m_fraction = lambda;
		result.m_normal = n;
		result.m_hitPoint = c;
		return true;
	}

	return false;

}